

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Detail::anon_unknown_0::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this_00;
  pointer pSVar1;
  unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>,_std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_>_>
  *in_RDI;
  pointer in_stack_ffffffffffffffc8;
  unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>,_std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_>_>
  *this_01;
  
  IStream::IStream((IStream *)in_RDI);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>,_std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_*,_std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_>_>
  .
  super__Head_base<0UL,_Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_*,_false>
  ._M_head_impl =
       (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *)
       &PTR__DebugOutStream_002485b8;
  this_00 = (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *)
            operator_new(0x148);
  StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::StreamBufImpl
            (this_00);
  std::
  unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>,std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>>>
  ::
  unique_ptr<std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,256ul>>,void>
            (in_RDI,in_stack_ffffffffffffffc8);
  this_01 = in_RDI + 2;
  pSVar1 = clara::std::
           unique_ptr<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>,_std::default_delete<Catch::Detail::(anonymous_namespace)::StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>_>_>
           ::get(in_RDI);
  std::ostream::ostream(this_01,&pSVar1->super_streambuf);
  return;
}

Assistant:

DebugOutStream()
            :   m_streamBuf( new StreamBufImpl<OutputDebugWriter>() ),
                m_os( m_streamBuf.get() )
            {}